

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O2

void __thiscall UEFITool::goToAddress(UEFITool *this)

{
  int iVar1;
  long *plVar2;
  QModelIndex index;
  
  QWidget::setFocus((QWidget *)(this->goToAddressDialog->ui->super_Ui_GoToAddressDialog).hexSpinBox)
  ;
  QAbstractSpinBox::selectAll();
  iVar1 = (**(code **)(*(long *)this->goToAddressDialog + 0x1a8))();
  if (iVar1 == 1) {
    iVar1 = QSpinBox::value();
    TreeModel::findByBase(&index,this->model,iVar1 - (int)this->ffsParser->addressDiff);
    if (((-1 < index.r) && (-1 < index.c)) && (index.m != (QAbstractItemModel *)0x0)) {
      (**(code **)(**(long **)(this->ui + 0x130) + 0x1e8))(*(long **)(this->ui + 0x130),&index,3);
      plVar2 = (long *)QAbstractItemView::selectionModel();
      (**(code **)(*plVar2 + 0x68))(plVar2,&index,0x23);
    }
  }
  return;
}

Assistant:

void UEFITool::goToAddress()
{
    goToAddressDialog->ui->hexSpinBox->setFocus();
    goToAddressDialog->ui->hexSpinBox->selectAll();
    if (goToAddressDialog->exec() != QDialog::Accepted)
        return;
    
    UINT32 address = (UINT32)goToAddressDialog->ui->hexSpinBox->value();
    QModelIndex index = model->findByBase(address - (UINT32)ffsParser->getAddressDiff());
    if (index.isValid()) {
        ui->structureTreeView->scrollTo(index, QAbstractItemView::PositionAtCenter);
        ui->structureTreeView->selectionModel()->select(index, QItemSelectionModel::Select | QItemSelectionModel::Rows | QItemSelectionModel::Clear);
    }
}